

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

void __thiscall
Cleaner::Cleaner(Cleaner *this,State *state,BuildConfig *config,DiskInterface *disk_interface)

{
  _Rb_tree_header *p_Var1;
  
  this->state_ = state;
  this->config_ = config;
  (this->dyndep_loader_).state_ = state;
  (this->dyndep_loader_).disk_interface_ = disk_interface;
  p_Var1 = &(this->removed_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->removed_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->removed_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->cleaned_)._M_t._M_impl.super__Rb_tree_header;
  (this->removed_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->cleaned_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cleaned_files_count_ = 0;
  this->disk_interface_ = disk_interface;
  this->status_ = 0;
  return;
}

Assistant:

Cleaner::Cleaner(State* state,
                 const BuildConfig& config,
                 DiskInterface* disk_interface)
  : state_(state),
    config_(config),
    dyndep_loader_(state, disk_interface),
    removed_(),
    cleaned_(),
    cleaned_files_count_(0),
    disk_interface_(disk_interface),
    status_(0) {
}